

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_TlsMgr.cpp
# Opt level: O0

bool axl::sys::deleteSimpleTlsSlot(size_t key)

{
  int iVar1;
  pthread_key_t in_EDI;
  int result;
  undefined1 local_51;
  uint_t in_stack_ffffffffffffffdc;
  ErrorRef *in_stack_ffffffffffffffe0;
  
  iVar1 = pthread_key_delete(in_EDI);
  if (iVar1 == 0) {
    local_51 = true;
  }
  else {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    local_51 = err::fail((ErrorRef *)0x1a4ef9);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x1a4f2e);
  }
  return local_51;
}

Assistant:

bool
deleteSimpleTlsSlot(size_t key) {
	int result = ::pthread_key_delete((pthread_key_t)key);
	return result != 0 ? err::fail(result) : true;
}